

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::checkInFlightQueries(CoreBroker *this,GlobalBrokerId brkid)

{
  ActionMessage *pAVar1;
  ActionMessage *pAVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  ActionMessage *this_00;
  long lVar6;
  JsonMapBuilder *this_01;
  long lVar7;
  pointer pAVar8;
  pointer pAVar9;
  pointer ptVar10;
  pointer ptVar11;
  string str;
  string local_68;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  pointer local_40;
  JsonMapBuilder *local_38;
  
  ptVar11 = (this->mapBuilders).
            super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ptVar10 = (this->mapBuilders).
            super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar11 != ptVar10) {
    this_01 = &(ptVar11->
               super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
               ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>._M_head_impl;
    bVar5 = fileops::JsonMapBuilder::isCompleted(this_01);
    if (!bVar5) {
      local_48 = &this->activeQueries;
      local_40 = ptVar10;
      do {
        bVar5 = fileops::JsonMapBuilder::clearComponents(this_01,brkid.gid);
        if (bVar5) {
          local_38 = this_01;
          fileops::JsonMapBuilder::generate_abi_cxx11_(&local_68,this_01);
          pAVar9 = (ptVar11->
                   super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                   ).
                   super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                   .
                   super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                   ._M_head_impl.
                   super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar8 = *(pointer *)
                    ((long)&(ptVar11->
                            super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                            ).
                            super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                            .
                            super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                            ._M_head_impl.
                            super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                            ._M_impl.super__Vector_impl_data + 8);
          if (1 < (int)((ulong)((long)pAVar8 - (long)pAVar9) >> 3) * -0x1642c859) {
            lVar7 = 0;
            lVar6 = 0;
            do {
              sVar4 = local_68._M_string_length;
              _Var3._M_p = local_68._M_dataplus._M_p;
              if (*(int *)((long)&(pAVar9->payload).buffer + lVar7 + 0xffffffffffffffd0U) ==
                  (this->super_BrokerBase).global_broker_id_local.gid) {
                gmlc::concurrency::
                DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::setDelayedValue(local_48,*(int *)((long)&(pAVar9->payload).buffer +
                                                   lVar7 + 0xffffffffffffffc4U),&local_68);
              }
              else {
                if ((byte *)local_68._M_dataplus._M_p ==
                    *(byte **)((long)&(pAVar9->payload).buffer + lVar7 + 0x50U)) {
                  *(size_type *)((long)&(pAVar9->payload).buffer + lVar7 + 0x40U) =
                       local_68._M_string_length;
                }
                else {
                  SmallBuffer::reserve
                            ((SmallBuffer *)((long)&(pAVar9->payload).buffer + lVar7),
                             local_68._M_string_length);
                  *(size_type *)((long)&(pAVar9->payload).buffer + lVar7 + 0x40U) = sVar4;
                  if (sVar4 != 0) {
                    memcpy(*(void **)((long)&(pAVar9->payload).buffer + lVar7 + 0x50U),_Var3._M_p,
                           sVar4);
                  }
                }
                routeMessage(this,(ActionMessage *)
                                  ((long)&(((ptVar11->
                                            super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                            ).
                                            super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                            .
                                            super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                                            ._M_head_impl.
                                            super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->payload).
                                          buffer + lVar7 + -0x40));
              }
              lVar6 = lVar6 + 1;
              pAVar9 = (ptVar11->
                       super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                       ).
                       super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                       .
                       super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                       ._M_head_impl.
                       super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pAVar8 = *(pointer *)
                        ((long)&(ptVar11->
                                super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                ).
                                super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                .
                                super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                                ._M_head_impl.
                                super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                                ._M_impl.super__Vector_impl_data + 8);
              lVar7 = lVar7 + 0xb8;
            } while (lVar6 < (int)((ulong)((long)pAVar8 - (long)pAVar9) >> 3) * -0x1642c859 + -1);
          }
          sVar4 = local_68._M_string_length;
          _Var3._M_p = local_68._M_dataplus._M_p;
          if (pAVar8[-1].dest_id.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
            gmlc::concurrency::
            DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::setDelayedValue(local_48,pAVar8[-1].messageID,&local_68);
          }
          else {
            if ((byte *)local_68._M_dataplus._M_p == pAVar8[-1].payload.heap) {
              pAVar8[-1].payload.bufferSize = local_68._M_string_length;
            }
            else {
              SmallBuffer::reserve(&pAVar8[-1].payload,local_68._M_string_length);
              pAVar8[-1].payload.bufferSize = sVar4;
              if (sVar4 != 0) {
                memcpy(pAVar8[-1].payload.heap,_Var3._M_p,sVar4);
              }
            }
            routeMessage(this,*(pointer *)
                               ((long)&(ptVar11->
                                       super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                       ).
                                       super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                       .
                                       super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                                       ._M_head_impl.
                                       super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                                       ._M_impl.super__Vector_impl_data + 8) + -1);
          }
          pAVar1 = (ptVar11->
                   super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                   ).
                   super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                   .
                   super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                   ._M_head_impl.
                   super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar2 = *(pointer *)
                    ((long)&(ptVar11->
                            super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                            ).
                            super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                            .
                            super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                            ._M_head_impl.
                            super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                            ._M_impl.super__Vector_impl_data + 8);
          this_00 = pAVar1;
          if (pAVar2 != pAVar1) {
            do {
              ActionMessage::~ActionMessage(this_00);
              this_00 = this_00 + 1;
            } while (this_00 != pAVar2);
            *(ActionMessage **)
             ((long)&(ptVar11->
                     super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                     ).
                     super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                     .
                     super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                     ._M_impl.super__Vector_impl_data + 8) = pAVar1;
          }
          if ((ptVar11->
              super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
              ).
              super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
              .super__Tuple_impl<2UL,_helics::QueryReuse>.
              super__Head_base<2UL,_helics::QueryReuse,_false>._M_head_impl == DISABLED) {
            fileops::JsonMapBuilder::reset(local_38);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          ptVar10 = local_40;
          if (ptVar11 + 1 == local_40) {
            return;
          }
        }
        else if (ptVar11 + 1 == ptVar10) {
          return;
        }
        this_01 = &ptVar11[1].
                   super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                   .super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>._M_head_impl;
        bVar5 = fileops::JsonMapBuilder::isCompleted(this_01);
        ptVar11 = ptVar11 + 1;
      } while (!bVar5);
    }
  }
  return;
}

Assistant:

void CoreBroker::sendErrorToImmediateBrokers(int errorCode)
{
    ActionMessage errorCom(CMD_ERROR);
    errorCom.messageID = errorCode;
    broadcast(errorCom);
}